

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::closeHandle(CommonCore *this,InterfaceHandle handle)

{
  byte *pbVar1;
  shared_mutex *__rwlock;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  BasicHandleInfo *pBVar3;
  InvalidIdentifier *this_00;
  string_view message;
  ActionMessage cmd;
  
  ppVar2 = getHandleInfo(this,handle);
  if (ppVar2 != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    if (((ppVar2->first)._M_string_length & 0x1000000000000000) == 0) {
      ActionMessage::ActionMessage(&cmd,cmd_close_interface);
      cmd._8_8_ = (ppVar2->first)._M_dataplus._M_p;
      cmd.messageID = (int32_t)*(char *)((long)&(ppVar2->first)._M_string_length + 4);
      BrokerBase::addActionMessage(&this->super_BrokerBase,&cmd);
      __rwlock = &(this->handles).m_mutex;
      std::__shared_mutex_pthread::lock(&__rwlock->_M_impl);
      pBVar3 = HandleManager::getHandleInfo(&(this->handles).m_obj,handle);
      pbVar1 = (byte *)((long)&pBVar3->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
      pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
      ActionMessage::~ActionMessage(&cmd);
    }
    return;
  }
  this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "invalid handle";
  message._M_len = 0xe;
  InvalidIdentifier::InvalidIdentifier(this_00,message);
  __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::closeHandle(InterfaceHandle handle)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, disconnected_flag)) {
        return;
    }
    ActionMessage cmd(CMD_CLOSE_INTERFACE);
    cmd.setSource(handleInfo->handle);
    cmd.messageID = static_cast<int32_t>(handleInfo->handleType);
    addActionMessage(cmd);
    handles.modify(
        [handle](auto& hand) { setActionFlag(*hand.getHandleInfo(handle), disconnected_flag); });
}